

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.c
# Opt level: O3

void nn_xpub_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist_data *data;
  
  data = (nn_dist_data *)nn_pipe_getdata(pipe);
  nn_dist_rm((nn_dist *)(self + 1),data);
  nn_free(data);
  return;
}

Assistant:

static void nn_xpub_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xpub *xpub;
    struct nn_xpub_data *data;

    xpub = nn_cont (self, struct nn_xpub, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_dist_rm (&xpub->outpipes, &data->item);

    nn_free (data);
}